

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFileImpl
          (DescriptorBuilder *this,FileDescriptorProto *proto)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Tables *pTVar1;
  OptionsToInterpret *__last;
  Message *descriptor;
  MessageLite *this_02;
  OptionsToInterpret *__first;
  Descriptor *pDVar2;
  bool bVar3;
  byte bVar4;
  int32 iVar5;
  int iVar6;
  FileDescriptor *file;
  SourceCodeInfo *this_03;
  FileDescriptorTables *pFVar7;
  string *psVar8;
  FileDescriptor **ppFVar9;
  GoogleOnceDynamic *pGVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **__s;
  Type *pTVar11;
  const_iterator cVar12;
  iterator iVar13;
  int *piVar14;
  Type *pTVar15;
  Type *proto_00;
  Type *proto_01;
  Type *proto_02;
  FileDescriptor *pFVar16;
  undefined4 extraout_var;
  FieldDescriptor *pFVar17;
  LogMessage *pLVar18;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Message *f;
  long lVar19;
  void *extraout_RDX;
  FileDescriptor *extraout_RDX_00;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_01;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_02;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_03;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *paVar20;
  FileDescriptor *extraout_RDX_04;
  FileDescriptor *extraout_RDX_05;
  FileDescriptor *extraout_RDX_06;
  int i;
  int iVar21;
  SourceCodeInfo *from;
  FileOptions *orig_options;
  OptionsToInterpret *pOVar22;
  int i_5;
  int i_3;
  int iVar23;
  DescriptorPool *pDVar24;
  long lVar25;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar26;
  FileDescriptor *dependency;
  OptionsToInterpret *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_148 [3];
  LogMessage local_118;
  OptionsToInterpret *local_e0;
  FileDescriptor *local_d8;
  string buf;
  set<int,_std::less<int>,_std::allocator<int>_> weak_deps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_dependencies;
  
  DescriptorPool::Tables::AddCheckpoint(this->tables_);
  file = DescriptorPool::Tables::Allocate<google::protobuf::FileDescriptor>(this->tables_);
  this->file_ = file;
  file[0x90] = (FileDescriptor)0x0;
  file[0xb8] = (FileDescriptor)0x0;
  if (((proto->_has_bits_).has_bits_[0] & 0x10) == 0) {
    this_03 = SourceCodeInfo::default_instance();
  }
  else {
    this_03 = DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
                        (this->tables_,(SourceCodeInfo *)0x0);
    from = proto->source_code_info_;
    if (from == (SourceCodeInfo *)0x0) {
      from = (SourceCodeInfo *)&_SourceCodeInfo_default_instance_;
    }
    SourceCodeInfo::CopyFrom(this_03,from);
  }
  *(SourceCodeInfo **)(file + 0xb0) = this_03;
  pFVar7 = DescriptorPool::Tables::AllocateFileTables(this->tables_);
  this->file_tables_ = pFVar7;
  *(FileDescriptorTables **)(this->file_ + 0xa8) = pFVar7;
  if (((proto->_has_bits_).has_bits_[0] & 1) == 0) {
    std::__cxx11::string::string((string *)&dependency,"",(allocator *)&local_118);
    AddError(this,(string *)&dependency,&proto->super_Message,OTHER,
             "Missing field: FileDescriptorProto.name.");
    std::__cxx11::string::~string((string *)&dependency);
  }
  __lhs = (proto->syntax_).ptr_;
  if (__lhs->_M_string_length != 0) {
    bVar3 = std::operator==(__lhs,"proto2");
    if (!bVar3) {
      bVar3 = std::operator==((proto->syntax_).ptr_,"proto3");
      if (bVar3) {
        *(undefined4 *)(this->file_ + 0x8c) = 3;
      }
      else {
        *(undefined4 *)(this->file_ + 0x8c) = 0;
        psVar8 = (proto->name_).ptr_;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dependency,"Unrecognized syntax: ",(proto->syntax_).ptr_);
        AddError(this,psVar8,&proto->super_Message,OTHER,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dependency);
        std::__cxx11::string::~string((string *)&dependency);
      }
      goto LAB_002e4eeb;
    }
  }
  *(undefined4 *)(this->file_ + 0x8c) = 2;
LAB_002e4eeb:
  psVar8 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)file = psVar8;
  pTVar1 = this->tables_;
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    std::__cxx11::string::string((string *)&dependency,"",(allocator *)&local_118);
    psVar8 = DescriptorPool::Tables::AllocateString(pTVar1,(string *)&dependency);
    *(string **)(file + 8) = psVar8;
    std::__cxx11::string::~string((string *)&dependency);
  }
  else {
    psVar8 = DescriptorPool::Tables::AllocateString(pTVar1,(proto->package_).ptr_);
    *(string **)(file + 8) = psVar8;
  }
  *(DescriptorPool **)(file + 0x10) = this->pool_;
  bVar3 = DescriptorPool::Tables::AddFile(this->tables_,file);
  if (bVar3) {
    if ((*(string **)(file + 8))->_M_string_length != 0) {
      AddPackage(this,*(string **)(file + 8),&proto->super_Message,file);
    }
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar21 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(file + 0x18) = iVar21;
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    ppFVar9 = DescriptorPool::Tables::AllocateArray<google::protobuf::FileDescriptor_const*>
                        (this->tables_,iVar21);
    *(FileDescriptor ***)(file + 0x20) = ppFVar9;
    if (this->pool_->lazily_build_dependencies_ == true) {
      pGVar10 = DescriptorPool::Tables::AllocateOnceDynamic(this->tables_);
      *(GoogleOnceDynamic **)(file + 0x30) = pGVar10;
      __s = DescriptorPool::Tables::AllocateArray<std::__cxx11::string_const*>
                      (this->tables_,(proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)(file + 0x28) = __s;
      memset(__s,0,(long)(proto->dependency_).super_RepeatedPtrFieldBase.current_size_ << 3);
    }
    else {
      *(undefined8 *)(file + 0x28) = 0;
      *(undefined8 *)(file + 0x30) = 0;
    }
    this_01 = &this->unused_dependency_;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&this_01->_M_t);
    weak_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &weak_deps._M_t._M_impl.super__Rb_tree_header._M_header;
    weak_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    weak_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    weak_deps._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    weak_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         weak_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (iVar21 = 0; iVar21 < (proto->weak_dependency_).current_size_; iVar21 = iVar21 + 1) {
      iVar5 = FileDescriptorProto::weak_dependency(proto,iVar21);
      dependency = (FileDescriptor *)CONCAT44(dependency._4_4_,iVar5);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&weak_deps._M_t,(int *)&dependency);
    }
    this_00 = &proto->dependency_;
    for (local_118.level_ = LOGLEVEL_INFO;
        (int)local_118.level_ < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
        local_118.level_ = local_118.level_ + LOGLEVEL_WARNING) {
      pTVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,local_118.level_);
      pVar26 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&seen_dependencies,pTVar11);
      if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        AddTwiceListedError(this,proto,local_118.level_);
      }
      pTVar1 = this->tables_;
      pTVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,local_118.level_);
      dependency = DescriptorPool::Tables::FindFile(pTVar1,pTVar11);
      if (dependency == (FileDescriptor *)0x0) {
        pDVar24 = this->pool_->underlay_;
        if (pDVar24 != (DescriptorPool *)0x0) {
          pTVar11 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_00->super_RepeatedPtrFieldBase,local_118.level_);
          dependency = DescriptorPool::FindFileByName(pDVar24,pTVar11);
          goto LAB_002e517a;
        }
        if (file != (FileDescriptor *)0x0) goto LAB_002e51e8;
LAB_002e55ab:
        DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
        goto LAB_002e5ac8;
      }
LAB_002e517a:
      if (dependency == file) goto LAB_002e55ab;
      if (dependency == (FileDescriptor *)0x0) {
LAB_002e51e8:
        pDVar24 = this->pool_;
        if (pDVar24->allow_unknown_ == false) {
          if (pDVar24->enforce_weak_ == false) {
            iVar13 = std::
                     _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                     find(&weak_deps._M_t,(key_type *)&local_118);
            pDVar24 = this->pool_;
            if ((_Rb_tree_header *)iVar13._M_node != &weak_deps._M_t._M_impl.super__Rb_tree_header)
            goto LAB_002e5220;
          }
          if (pDVar24->lazily_build_dependencies_ == false) {
            AddImportError(this,proto,local_118.level_);
          }
        }
        else {
LAB_002e5220:
          pTVar11 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_00->super_RepeatedPtrFieldBase,local_118.level_);
          dependency = DescriptorPool::NewPlaceholderFileWithMutexHeld(pDVar24,pTVar11);
        }
      }
      else if (this->pool_->enforce_dependencies_ == true) {
        cVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&(this->pool_->unused_import_track_files_)._M_t,(proto->name_).ptr_);
        if (((_Rb_tree_header *)cVar12._M_node !=
             &(this->pool_->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header) &&
           (*(int *)(dependency + 0x38) == 0)) {
          std::
          _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                    ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)this_01,&dependency);
        }
      }
      *(FileDescriptor **)(*(long *)(file + 0x20) + (long)(int)local_118.level_ * 8) = dependency;
      if ((dependency == (FileDescriptor *)0x0 & this->pool_->lazily_build_dependencies_) == 1) {
        pTVar1 = this->tables_;
        pTVar11 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,local_118.level_);
        psVar8 = DescriptorPool::Tables::AllocateString(pTVar1,pTVar11);
        *(string **)(*(long *)(file + 0x28) + (long)(int)local_118.level_ * 8) = psVar8;
      }
    }
    piVar14 = DescriptorPool::Tables::AllocateArray<int>
                        (this->tables_,(proto->public_dependency_).current_size_);
    *(int **)(file + 0x40) = piVar14;
    iVar23 = 0;
    for (iVar21 = 0; iVar21 < (proto->public_dependency_).current_size_; iVar21 = iVar21 + 1) {
      iVar5 = FileDescriptorProto::public_dependency(proto,iVar21);
      if ((iVar5 < 0) || ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar5)) {
        AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
                 "Invalid public dependency index.");
      }
      else {
        lVar19 = (long)iVar23;
        iVar23 = iVar23 + 1;
        *(int32 *)(*(long *)(file + 0x40) + lVar19 * 4) = iVar5;
        if (this->pool_->lazily_build_dependencies_ == false) {
          dependency = FileDescriptor::dependency(file,iVar5);
          std::
          _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::erase(&this_01->_M_t,&dependency);
        }
      }
    }
    *(int *)(file + 0x38) = iVar23;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&(this->dependencies_)._M_t);
    if (this->pool_->lazily_build_dependencies_ == false) {
      for (iVar21 = 0; iVar21 < *(int *)(file + 0x18); iVar21 = iVar21 + 1) {
        pFVar16 = FileDescriptor::dependency(file,iVar21);
        RecordPublicDependencies(this,pFVar16);
      }
    }
    piVar14 = DescriptorPool::Tables::AllocateArray<int>
                        (this->tables_,(proto->weak_dependency_).current_size_);
    *(int **)(file + 0x50) = piVar14;
    iVar21 = 0;
    for (iVar23 = 0; iVar23 < (proto->weak_dependency_).current_size_; iVar23 = iVar23 + 1) {
      iVar5 = FileDescriptorProto::weak_dependency(proto,iVar23);
      if ((iVar5 < 0) || ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar5)) {
        AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
                 "Invalid weak dependency index.");
      }
      else {
        lVar19 = (long)iVar21;
        iVar21 = iVar21 + 1;
        *(int32 *)(*(long *)(file + 0x50) + lVar19 * 4) = iVar5;
      }
    }
    *(int *)(file + 0x48) = iVar21;
    iVar21 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(file + 0x58) = iVar21;
    local_d8 = file + 0x60;
    AllocateArray<google::protobuf::Descriptor>(this,iVar21,(Descriptor **)local_d8);
    lVar25 = 0;
    for (lVar19 = 0; lVar19 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
        lVar19 = lVar19 + 1) {
      pTVar15 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                          (&(proto->message_type_).super_RepeatedPtrFieldBase,(int)lVar19);
      BuildMessage(this,pTVar15,(Descriptor *)0x0,*(Descriptor **)local_d8 + lVar25);
      lVar25 = lVar25 + 0xa8;
    }
    iVar21 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(file + 0x68) = iVar21;
    AllocateArray<google::protobuf::EnumDescriptor>(this,iVar21,(EnumDescriptor **)(file + 0x70));
    lVar19 = 0;
    for (lVar25 = 0; lVar25 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        lVar25 = lVar25 + 1) {
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar25);
      BuildEnum(this,proto_00,(Descriptor *)0x0,*(EnumDescriptor **)(file + 0x70) + lVar19);
      lVar19 = lVar19 + 0x38;
    }
    iVar21 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(file + 0x78) = iVar21;
    AllocateArray<google::protobuf::ServiceDescriptor>
              (this,iVar21,(ServiceDescriptor **)(file + 0x80));
    lVar19 = 0;
    for (lVar25 = 0; lVar25 < (proto->service_).super_RepeatedPtrFieldBase.current_size_;
        lVar25 = lVar25 + 1) {
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                           (&(proto->service_).super_RepeatedPtrFieldBase,(int)lVar25);
      BuildService(this,proto_01,extraout_RDX,*(ServiceDescriptor **)(file + 0x80) + lVar19);
      lVar19 = lVar19 + 0x30;
    }
    iVar21 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(file + 0x88) = iVar21;
    AllocateArray<google::protobuf::FieldDescriptor>(this,iVar21,(FieldDescriptor **)(file + 0x98));
    lVar19 = 0;
    for (lVar25 = 0; lVar25 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
        lVar25 = lVar25 + 1) {
      proto_02 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar25);
      BuildExtension(this,proto_02,(Descriptor *)0x0,
                     (FieldDescriptor *)(*(long *)(file + 0x98) + lVar19));
      lVar19 = lVar19 + 0xa8;
    }
    if (((proto->_has_bits_).has_bits_[0] & 8) == 0) {
      *(undefined8 *)(file + 0xa0) = 0;
    }
    else {
      orig_options = proto->options_;
      if (orig_options == (FileOptions *)0x0) {
        orig_options = (FileOptions *)&_FileOptions_default_instance_;
      }
      AllocateOptions(this,orig_options,file);
    }
    CrossLinkFile(this,file,proto);
    bVar4 = this->had_errors_;
    pFVar16 = extraout_RDX_00;
    if ((bool)bVar4 == false) {
      OptionInterpreter::OptionInterpreter((OptionInterpreter *)&dependency,this);
      paVar20 = extraout_RDX_01;
      for (pOVar22 = (this->options_to_interpret_).
                     super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          __last = (this->options_to_interpret_).
                   super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pOVar22 != __last;
          pOVar22 = pOVar22 + 1) {
        descriptor = pOVar22->original_options;
        this_02 = &pOVar22->options->super_MessageLite;
        local_150 = pOVar22;
        local_e0 = pOVar22;
        iVar21 = (*this_02->_vptr_MessageLite[0x17])(this_02);
        std::__cxx11::string::string((string *)&local_118,"uninterpreted_option",(allocator *)&buf);
        pFVar17 = Descriptor::FindFieldByName
                            ((Descriptor *)CONCAT44(extraout_var,iVar21),(string *)&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        if (pFVar17 == (FieldDescriptor *)0x0) {
          internal::LogMessage::LogMessage
                    (&local_118,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1740);
          pLVar18 = internal::LogMessage::operator<<
                              (&local_118,"CHECK failed: uninterpreted_options_field != NULL: ");
          pLVar18 = internal::LogMessage::operator<<
                              (pLVar18,
                               "No field named \"uninterpreted_option\" in the Options proto.");
          internal::LogFinisher::operator=((LogFinisher *)&buf,pLVar18);
          internal::LogMessage::~LogMessage(&local_118);
        }
        iVar21 = (*this_02->_vptr_MessageLite[0x16])(this_02);
        (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar21) + 0x38))
                  ((long *)CONCAT44(extraout_var_00,iVar21),this_02,pFVar17);
        iVar21 = (*(descriptor->super_MessageLite)._vptr_MessageLite[0x17])(descriptor);
        std::__cxx11::string::string((string *)&local_118,"uninterpreted_option",(allocator *)&buf);
        pFVar17 = Descriptor::FindFieldByName
                            ((Descriptor *)CONCAT44(extraout_var_01,iVar21),(string *)&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        if (pFVar17 == (FieldDescriptor *)0x0) {
          internal::LogMessage::LogMessage
                    (&local_118,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1748);
          pLVar18 = internal::LogMessage::operator<<
                              (&local_118,
                               "CHECK failed: original_uninterpreted_options_field != NULL: ");
          pLVar18 = internal::LogMessage::operator<<
                              (pLVar18,
                               "No field named \"uninterpreted_option\" in the Options proto.");
          internal::LogFinisher::operator=((LogFinisher *)&buf,pLVar18);
          internal::LogMessage::~LogMessage(&local_118);
        }
        iVar21 = (*(descriptor->super_MessageLite)._vptr_MessageLite[0x16])(descriptor);
        iVar21 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar21) + 0x30))
                           ((long *)CONCAT44(extraout_var_02,iVar21),descriptor,pFVar17);
        iVar23 = 0;
        if (iVar21 < 1) {
          iVar21 = iVar23;
        }
        do {
          if (iVar21 == iVar23) {
            local_150 = (OptionsToInterpret *)0x0;
            aaStack_148[0]._M_allocated_capacity = (UninterpretedOption *)0x0;
            buf._M_dataplus._M_p = (pointer)&buf.field_2;
            buf._M_string_length = 0;
            buf.field_2._M_local_buf[0] = '\0';
            bVar3 = MessageLite::AppendPartialToString(this_02,&buf);
            pOVar22 = local_e0;
            if (!bVar3) {
              internal::LogMessage::LogMessage
                        (&local_118,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                         ,0x1765);
              pLVar18 = internal::LogMessage::operator<<
                                  (&local_118,"CHECK failed: options->AppendPartialToString(&buf): "
                                  );
              pLVar18 = internal::LogMessage::operator<<
                                  (pLVar18,"Protocol message could not be serialized.");
              internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar18);
              internal::LogMessage::~LogMessage(&local_118);
            }
            bVar3 = MessageLite::ParsePartialFromString(this_02,&buf);
            if (!bVar3) {
              internal::LogMessage::LogMessage
                        (&local_118,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                         ,0x1767);
              pLVar18 = internal::LogMessage::operator<<
                                  (&local_118,"CHECK failed: options->ParsePartialFromString(buf): "
                                  );
              pLVar18 = internal::LogMessage::operator<<
                                  (pLVar18,"Protocol message serialized itself in invalid fashion.")
              ;
              internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar18);
              internal::LogMessage::~LogMessage(&local_118);
            }
            iVar21 = (*this_02->_vptr_MessageLite[8])(this_02);
            pFVar16 = dependency;
            if ((char)iVar21 == '\0') {
              (*this_02->_vptr_MessageLite[9])(&local_80,this_02);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_118,
                             "Options could not be fully parsed using the proto descriptors compiled into this binary. Missing required fields: "
                             ,&local_80);
              AddWarning((DescriptorBuilder *)pFVar16,&pOVar22->element_name,descriptor,OTHER,
                         (string *)&local_118);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&local_80);
            }
            std::__cxx11::string::~string((string *)&buf);
            paVar20 = extraout_RDX_03;
            goto LAB_002e59f3;
          }
          iVar6 = (*(descriptor->super_MessageLite)._vptr_MessageLite[0x16])(descriptor);
          f = (Message *)
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0x1a0))
                        ((long *)CONCAT44(extraout_var_03,iVar6),descriptor,pFVar17,iVar23);
          aaStack_148[0]._0_8_ =
               internal::
               down_cast<google::protobuf::UninterpretedOption_const*,google::protobuf::Message_const>
                         (f);
          bVar3 = OptionInterpreter::InterpretSingleOption
                            ((OptionInterpreter *)&dependency,(Message *)this_02);
          iVar23 = iVar23 + 1;
        } while (bVar3);
        local_150 = (OptionsToInterpret *)0x0;
        aaStack_148[0]._M_allocated_capacity = (UninterpretedOption *)0x0;
        paVar20 = extraout_RDX_02;
        pOVar22 = local_e0;
LAB_002e59f3:
      }
      __first = (this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pOVar22 != __first) {
        std::
        _Destroy<google::protobuf::(anonymous_namespace)::OptionsToInterpret*,google::protobuf::(anonymous_namespace)::OptionsToInterpret>
                  (__first,__last,paVar20);
        (this->options_to_interpret_).
        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
        ._M_impl.super__Vector_impl_data._M_finish = __first;
      }
      OptionInterpreter::~OptionInterpreter((OptionInterpreter *)&dependency);
      bVar4 = this->had_errors_;
      pFVar16 = extraout_RDX_04;
    }
    if (((bVar4 & 1) == 0) && (this->pool_->lazily_build_dependencies_ == false)) {
      ValidateFileOptions(this,file,proto);
      bVar4 = this->had_errors_;
      pFVar16 = extraout_RDX_05;
    }
    if ((bVar4 & 1) != 0) {
      lVar25 = 0;
      for (lVar19 = 0; lVar19 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
          lVar19 = lVar19 + 1) {
        pDVar2 = *(Descriptor **)local_d8;
        pTVar15 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                            (&(proto->message_type_).super_RepeatedPtrFieldBase,(int)lVar19);
        DetectMapConflicts(this,pDVar2 + lVar25,pTVar15);
        lVar25 = lVar25 + 0xa8;
        pFVar16 = extraout_RDX_06;
      }
    }
    if (((this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       (this->pool_->lazily_build_dependencies_ == false)) {
      LogUnusedDependency(this,proto,pFVar16);
    }
    if (this->had_errors_ == true) {
      DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
LAB_002e5ac8:
      file = (FileDescriptor *)0x0;
    }
    else {
      DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
      file[0xb8] = (FileDescriptor)0x1;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&weak_deps._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&seen_dependencies._M_t);
  }
  else {
    AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
             "A file with this name is already in the pool.");
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
    file = (FileDescriptor *)0x0;
  }
  return file;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFileImpl(
    const FileDescriptorProto& proto) {
  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = tables_->Allocate<FileDescriptor>();
  file_ = result;

  result->is_placeholder_ = false;
  result->finished_building_ = false;
  if (proto.has_source_code_info()) {
    SourceCodeInfo *info = tables_->AllocateMessage<SourceCodeInfo>();
    info->CopyFrom(proto.source_code_info());
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = tables_->AllocateFileTables();
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  // TODO(liujisi): Report error when the syntax is empty after all the protos
  // have added the syntax statement.
  if (proto.syntax().empty() || proto.syntax() == "proto2") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO2;
  } else if (proto.syntax() == "proto3") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO3;
  } else {
    file_->syntax_ = FileDescriptor::SYNTAX_UNKNOWN;
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Unrecognized syntax: " + proto.syntax());
  }

  result->name_ = tables_->AllocateString(proto.name());
  if (proto.has_package()) {
    result->package_ = tables_->AllocateString(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = tables_->AllocateString("");
  }
  result->pool_ = pool_;

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    tables_->RollbackToLastCheckpoint();
    return NULL;
  }
  if (!result->package().empty()) {
    AddPackage(result->package(), proto, result);
  }

  // Make sure all dependencies are loaded.
  std::set<string> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
      tables_->AllocateArray<const FileDescriptor*>(proto.dependency_size());
  if (pool_->lazily_build_dependencies_) {
    result->dependencies_once_ = tables_->AllocateOnceDynamic();
    result->dependencies_names_ =
        tables_->AllocateArray<const string*>(proto.dependency_size());
    memset(result->dependencies_names_, 0,
           sizeof(*result->dependencies_names_) * proto.dependency_size());
  } else {
    result->dependencies_once_ = NULL;
    result->dependencies_names_ = NULL;
  }
  unused_dependency_.clear();
  std::set<int> weak_deps;
  for (int i = 0; i < proto.weak_dependency_size(); ++i) {
    weak_deps.insert(proto.weak_dependency(i));
  }
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddTwiceListedError(proto, i);
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == NULL && pool_->underlay_ != NULL) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == result) {
      // Recursive import.  dependency/result is not fully initialized, and it's
      // dangerous to try to do anything with it.  The recursive import error
      // will be detected and reported in DescriptorBuilder::BuildFile().
      tables_->RollbackToLastCheckpoint();
      return NULL;
    }

    if (dependency == NULL) {
      if (pool_->allow_unknown_ ||
          (!pool_->enforce_weak_ && weak_deps.find(i) != weak_deps.end())) {
        dependency =
            pool_->NewPlaceholderFileWithMutexHeld(proto.dependency(i));
      } else {
        if (!pool_->lazily_build_dependencies_) {
          AddImportError(proto, i);
        }
      }
    } else {
      // Add to unused_dependency_ to track unused imported files.
      // Note: do not track unused imported files for public import.
      if (pool_->enforce_dependencies_ &&
          (pool_->unused_import_track_files_.find(proto.name()) !=
           pool_->unused_import_track_files_.end()) &&
          (dependency->public_dependency_count() == 0)) {
        unused_dependency_.insert(dependency);
      }
    }

    result->dependencies_[i] = dependency;
    if (pool_->lazily_build_dependencies_ && !dependency) {
      result->dependencies_names_[i] =
          tables_->AllocateString(proto.dependency(i));
    }
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ = tables_->AllocateArray<int>(
      proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
      // Do not track unused imported files for public import.
      // Calling dependency(i) builds that file when doing lazy imports,
      // need to avoid doing this. Unused dependency detection isn't done
      // when building lazily, anyways.
      if (!pool_->lazily_build_dependencies_) {
        unused_dependency_.erase(result->dependency(index));
      }
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  // We don't/can't do proper dependency error checking when
  // lazily_build_dependencies_, and calling dependency(i) will force
  // a dependency to be built, which we don't want.
  if (!pool_->lazily_build_dependencies_) {
    for (int i = 0; i < result->dependency_count(); i++) {
      RecordPublicDependencies(result->dependency(i));
    }
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ = tables_->AllocateArray<int>(
      proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage  , NULL);
  BUILD_ARRAY(proto, result, enum_type   , BuildEnum     , NULL);
  BUILD_ARRAY(proto, result, service     , BuildService  , NULL);
  BUILD_ARRAY(proto, result, extension   , BuildExtension, NULL);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  // Interpret any remaining uninterpreted options gathered into
  // options_to_interpret_ during descriptor building.  Cross-linking has made
  // extension options known, so all interpretations should now succeed.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptions(&(*iter));
    }
    options_to_interpret_.clear();
  }

  // Validate options. See comments at InternalSetLazilyBuildDependencies about
  // error checking and lazy import building.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    ValidateFileOptions(result, proto);
  }

  // Additional naming conflict check for map entry types. Only need to check
  // this if there are already errors.
  if (had_errors_) {
    for (int i = 0; i < proto.message_type_size(); ++i) {
      DetectMapConflicts(result->message_type(i), proto.message_type(i));
    }
  }


  // Again, see comments at InternalSetLazilyBuildDependencies about error
  // checking.
  if (!unused_dependency_.empty() && !pool_->lazily_build_dependencies_) {
    LogUnusedDependency(proto, result);
  }

  if (had_errors_) {
    tables_->RollbackToLastCheckpoint();
    return NULL;
  } else {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
    return result;
  }
}